

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Address::ToString_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  size_type sVar1;
  uchar *puVar2;
  char *pcVar3;
  char *ret_1;
  char ipv6 [46];
  char *ret;
  char ipv4 [16];
  Address *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mBytes);
  if (sVar1 == 4) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mBytes);
    pcVar3 = inet_ntop(2,puVar2,(char *)&ret,0x10);
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,ToString::kInvalidAddr);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar3);
    }
  }
  else {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mBytes);
    if (sVar1 == 0x10) {
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mBytes);
      pcVar3 = inet_ntop(10,puVar2,(char *)&ret_1,0x2e);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,ToString::kInvalidAddr);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar3);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,ToString::kInvalidAddr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToString() const
{
    static const char *kInvalidAddr = "INVALID_ADDR";
    std::string        result;

    if (mBytes.size() == kIpv4Size)
    {
        char ipv4[INET_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET, mBytes.data(), ipv4, sizeof(ipv4));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else if (mBytes.size() == kIpv6Size)
    {
        char ipv6[INET6_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET6, mBytes.data(), ipv6, sizeof(ipv6));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else
    {
        ExitNow(result = kInvalidAddr);
    }

exit:
    return result;
}